

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_superblock.cpp
# Opt level: O1

size_t duckdb_zstd::ZSTD_compressSuperBlock
                 (ZSTD_CCtx *zc,void *dst,size_t dstCapacity,void *src,size_t srcSize,uint lastBlock
                 )

{
  ushort uVar1;
  uint uVar2;
  uint *count;
  undefined8 uVar3;
  ZSTD_compressedBlockState_t *pZVar4;
  int iVar5;
  size_t err_code;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  size_t __n;
  size_t matchLengthSum;
  size_t sVar13;
  void *__src;
  uint uVar14;
  U32 UVar15;
  U32 UVar16;
  U32 UVar17;
  ulong uVar18;
  BYTE *pBVar19;
  undefined4 in_register_0000008c;
  seqDef *psVar20;
  U32 UVar21;
  seqDef *psVar22;
  ulong uVar23;
  ulong nbSeq;
  long lVar24;
  size_t in_stack_fffffffffffffd98;
  int litEntropyWritten;
  U32 UStack_25c;
  U32 local_258;
  ulong local_250;
  undefined2 *local_248;
  int seqEntropyWritten;
  BYTE *local_238;
  undefined2 *local_230;
  ulong local_228;
  void *local_220;
  ZSTD_compressedBlockState_t *local_218;
  seqDef *local_210;
  BYTE *local_208;
  size_t local_200;
  seqDef *local_1f8;
  void *local_1f0;
  BYTE *local_1e8;
  BYTE *local_1e0;
  BYTE *local_1d8;
  size_t local_1d0;
  undefined8 local_1c8;
  ulong local_1c0;
  size_t local_1b8;
  ZSTD_compressedBlockState_t *local_1b0;
  undefined8 local_1a8;
  size_t local_1a0;
  ulong local_198;
  ZSTD_CCtx_params *local_190;
  ulong local_188;
  seqDef *local_180;
  size_t local_178;
  ulong local_170;
  ZSTD_entropyCTablesMetadata_t entropyMetadata;
  
  local_1a8 = CONCAT44(in_register_0000008c,lastBlock);
  local_190 = &zc->appliedParams;
  local_1f0 = src;
  local_1d0 = dstCapacity;
  local_1a0 = srcSize;
  sVar6 = ZSTD_buildBlockEntropyStats
                    (&zc->seqStore,&((zc->blockState).prevCBlock)->entropy,
                     &((zc->blockState).nextCBlock)->entropy,local_190,&entropyMetadata,
                     zc->entropyWorkspace,0x22d8);
  if (sVar6 < 0xffffffffffffff89) {
    psVar22 = (zc->seqStore).sequencesStart;
    psVar20 = (zc->seqStore).sequences;
    pBVar19 = (zc->seqStore).litStart;
    local_1d0 = local_1d0 + (long)dst;
    uVar12 = (zc->appliedParams).targetCBlockSize;
    local_250 = 0x53c;
    if (0x53c < uVar12) {
      local_250 = uVar12;
    }
    local_238 = (zc->seqStore).lit;
    local_228 = (ulong)(entropyMetadata.hufMetadata.hType == set_compressed);
    local_1b0 = (zc->blockState).prevCBlock;
    local_218 = (zc->blockState).nextCBlock;
    local_198 = (ulong)(uint)zc->bmi2;
    local_1d8 = (zc->seqStore).llCode;
    local_1e0 = (zc->seqStore).mlCode;
    local_1e8 = (zc->seqStore).ofCode;
    local_230 = (undefined2 *)dst;
    local_210 = psVar20;
    local_1f8 = psVar22;
    if (psVar20 == psVar22) {
      local_250 = 1;
      local_220 = local_1f0;
      local_248 = (undefined2 *)dst;
    }
    else {
      sVar13 = (long)psVar20 - (long)psVar22 >> 3;
      sVar6 = (long)local_238 - (long)pBVar19;
      count = zc->entropyWorkspace;
      _litEntropyWritten = CONCAT44(UStack_25c,0xff);
      local_1b8 = sVar6;
      local_208 = pBVar19;
      if (entropyMetadata.hufMetadata.hType - set_compressed < 2) {
        sVar7 = HIST_count_wksp(count,(uint *)&litEntropyWritten,pBVar19,sVar6,count,0x22d8);
        if (sVar7 < 0xffffffffffffff89) {
          sVar7 = HUF_estimateCompressedSize((HUF_CElt *)local_218,count,litEntropyWritten);
          if (entropyMetadata.hufMetadata.hType != set_compressed) {
            entropyMetadata.hufMetadata.hufDesSize = 0;
          }
          local_1b8 = entropyMetadata.hufMetadata.hufDesSize + sVar7 + 3;
        }
      }
      else if (entropyMetadata.hufMetadata.hType != set_basic) {
        if (entropyMetadata.hufMetadata.hType == set_rle) {
          local_1b8 = 1;
        }
        else {
          local_1b8 = 0;
        }
      }
      pZVar4 = local_218;
      local_200 = sVar6;
      sVar6 = ZSTD_estimateSubBlockSize_symbolType
                        (entropyMetadata.fseMetadata.ofType,local_1e8,0x1f,sVar13,
                         (local_218->entropy).fse.offcodeCTable,(U8 *)0x0,(short *)OF_defaultNorm,5,
                         0x1c,count,in_stack_fffffffffffffd98);
      sVar7 = ZSTD_estimateSubBlockSize_symbolType
                        (entropyMetadata.fseMetadata.llType,local_1d8,0x23,sVar13,
                         (pZVar4->entropy).fse.litlengthCTable,LL_bits,(short *)LL_defaultNorm,6,
                         0x23,count,in_stack_fffffffffffffd98);
      sVar8 = ZSTD_estimateSubBlockSize_symbolType
                        (entropyMetadata.fseMetadata.mlType,local_1e0,0x34,sVar13,
                         (pZVar4->entropy).fse.matchlengthCTable,ML_bits,(short *)ML_defaultNorm,6,
                         0x34,count,in_stack_fffffffffffffd98);
      uVar12 = entropyMetadata.fseMetadata.fseTablesSize + sVar8 + sVar7 + sVar6 + local_1b8 + 6;
      if (local_238 == local_208) {
        uVar9 = 0x100;
      }
      else {
        uVar9 = (local_1b8 << 8) / local_200;
      }
      sVar6 = 0;
      uVar10 = ((uVar12 - local_1b8) * 0x100) / sVar13;
      local_250 = ((local_250 >> 1) + uVar12) / local_250;
      uVar18 = local_250 + (local_250 == 0);
      uVar11 = (uVar12 * 0x100) / uVar18;
      local_250 = 1;
      pBVar19 = local_208;
      psVar20 = local_210;
      psVar22 = local_1f8;
      if (local_1a0 < uVar12) {
        local_1c8 = 0;
        local_248 = local_230;
        local_220 = local_1f0;
      }
      else {
        local_1c8 = 1;
        sVar13 = uVar18 - 1;
        if (sVar13 == 0) {
          local_248 = local_230;
          local_220 = local_1f0;
        }
        else {
          local_250 = 1;
          local_170 = uVar10 + 0x7800;
          local_220 = local_1f0;
          local_248 = local_230;
          sVar7 = 0;
          local_1c0 = uVar9;
          local_188 = uVar10;
          local_178 = sVar13;
          do {
            uVar18 = (long)psVar20 - (long)psVar22 >> 3;
            uVar12 = uVar10;
            if (sVar7 == 0) {
              uVar12 = local_170;
            }
            uVar23 = 1;
            nbSeq = uVar23;
            if (1 < uVar18) {
              uVar12 = uVar12 + uVar9 * psVar22->litLength;
              if (uVar12 <= uVar11) {
                lVar24 = (ulong)psVar22->litLength + (ulong)psVar22->mlBase + 3;
                do {
                  uVar12 = uVar12 + uVar10 + uVar9 * psVar22[uVar23].litLength;
                  lVar24 = lVar24 + (ulong)psVar22[uVar23].litLength + (ulong)psVar22[uVar23].mlBase
                           + 3;
                  if ((uVar11 < uVar12) && (nbSeq = uVar23, uVar12 < (ulong)(lVar24 * 0x100)))
                  break;
                  uVar23 = uVar23 + 1;
                  nbSeq = uVar18;
                } while (uVar18 != uVar23);
              }
            }
            local_1b8 = sVar7;
            if (psVar22 + nbSeq == psVar20) {
              iVar5 = 6;
            }
            else {
              _litEntropyWritten = _litEntropyWritten & 0xffffffff00000000;
              seqEntropyWritten = 0;
              uVar9 = (long)psVar22 - (long)(zc->seqStore).sequencesStart;
              UVar17 = (zc->seqStore).longLengthPos;
              sVar7 = 0;
              sVar13 = 0;
              uVar12 = uVar9;
              do {
                uVar1 = psVar22[sVar7].litLength;
                uVar14 = (uint)uVar1;
                if (UVar17 == (U32)(uVar12 >> 3)) {
                  uVar14 = uVar1 + 0x10000;
                  if ((zc->seqStore).longLengthType != ZSTD_llt_literalLength) {
                    uVar14 = (uint)uVar1;
                  }
                }
                sVar13 = sVar13 + uVar14;
                sVar7 = sVar7 + 1;
                uVar12 = uVar12 + 8;
              } while (nbSeq != sVar7);
              lVar24 = 0;
              sVar7 = 0;
              do {
                uVar14 = psVar22[sVar7].mlBase + 3;
                if ((UVar17 == (U32)(uVar9 >> 3)) &&
                   ((zc->seqStore).longLengthType == ZSTD_llt_matchLength)) {
                  uVar14 = psVar22[sVar7].mlBase + 0x10003;
                }
                lVar24 = lVar24 + (ulong)uVar14;
                sVar7 = sVar7 + 1;
                uVar9 = uVar9 + 8;
              } while (nbSeq != sVar7);
              local_208 = pBVar19;
              local_200 = sVar6;
              local_180 = psVar22 + nbSeq;
              sVar7 = ZSTD_compressSubBlock
                                (&local_218->entropy,&entropyMetadata,psVar22,nbSeq,pBVar19,sVar13,
                                 local_1d8,local_1e0,local_1e8,local_190,local_248,
                                 local_1d0 - (long)local_248,(int)local_198,(int)local_228,
                                 (int)local_250,&litEntropyWritten,&seqEntropyWritten,0);
              iVar5 = 1;
              uVar10 = local_188;
              pBVar19 = local_208;
              sVar6 = sVar7;
              psVar20 = local_210;
              uVar9 = local_1c0;
              if (((sVar7 < 0xffffffffffffff89) && (iVar5 = 0, sVar6 = local_200, sVar7 != 0)) &&
                 (sVar7 < lVar24 + sVar13)) {
                local_220 = (void *)((long)local_220 + lVar24 + sVar13);
                pBVar19 = local_208 + sVar13;
                local_248 = (undefined2 *)((long)local_248 + sVar7);
                local_1d8 = local_1d8 + nbSeq;
                local_1e0 = local_1e0 + nbSeq;
                local_1e8 = local_1e8 + nbSeq;
                iVar5 = 0;
                local_228 = local_228 & 0xffffffff;
                if (litEntropyWritten != 0) {
                  local_228 = 0;
                }
                local_250 = local_250 & 0xffffffff;
                psVar22 = local_180;
                if (seqEntropyWritten != 0) {
                  local_250 = 0;
                }
              }
            }
            if (iVar5 != 0) {
              if (iVar5 != 6) {
                local_1c8 = 0;
              }
              break;
            }
            sVar7 = local_1b8 + 1;
          } while (sVar7 != local_178);
        }
      }
      if ((char)local_1c8 == '\0') {
        return sVar6;
      }
    }
    local_238 = (BYTE *)((long)local_238 - (long)pBVar19);
    sVar13 = (long)psVar20 - (long)psVar22 >> 3;
    lVar24 = 0;
    _litEntropyWritten = (ulong)UStack_25c << 0x20;
    seqEntropyWritten = 0;
    if (psVar20 != psVar22) {
      uVar12 = (long)psVar22 - (long)(zc->seqStore).sequencesStart;
      lVar24 = 0;
      sVar7 = 0;
      do {
        uVar14 = psVar22[sVar7].mlBase + 3;
        if (((zc->seqStore).longLengthPos == (U32)(uVar12 >> 3)) &&
           ((zc->seqStore).longLengthType == ZSTD_llt_matchLength)) {
          uVar14 = psVar22[sVar7].mlBase + 0x10003;
        }
        lVar24 = lVar24 + (ulong)uVar14;
        sVar7 = sVar7 + 1;
        uVar12 = uVar12 + 8;
      } while (sVar13 != sVar7);
    }
    local_200 = sVar6;
    sVar7 = ZSTD_compressSubBlock
                      (&local_218->entropy,&entropyMetadata,psVar22,sVar13,pBVar19,(size_t)local_238
                       ,local_1d8,local_1e0,local_1e8,local_190,local_248,
                       local_1d0 - (long)local_248,(int)local_198,(int)local_228,(int)local_250,
                       &litEntropyWritten,&seqEntropyWritten,(U32)local_1a8);
    psVar20 = local_1f8;
    __src = local_220;
    sVar6 = sVar7;
    if (((sVar7 < 0xffffffffffffff89) && (sVar6 = local_200, sVar7 != 0)) &&
       (sVar7 < (ulong)(lVar24 + (long)local_238))) {
      local_248 = (undefined2 *)((long)local_248 + sVar7);
      local_228 = local_228 & 0xffffffff;
      if (litEntropyWritten != 0) {
        local_228 = 0;
      }
      local_250 = local_250 & 0xffffffff;
      if (seqEntropyWritten != 0) {
        local_250 = 0;
      }
      psVar22 = psVar22 + sVar13;
      __src = (void *)((long)local_220 + lVar24 + (long)local_238);
    }
    if (sVar7 < 0xffffffffffffff89) {
      if ((int)local_228 != 0) {
        switchD_00b1422a::default(local_218,local_1b0,0x810);
      }
      if (((int)local_250 == 0) ||
         (((1 < entropyMetadata.fseMetadata.llType - set_rle &&
           (1 < entropyMetadata.fseMetadata.mlType - set_rle)) &&
          (entropyMetadata.fseMetadata.ofType - set_repeat < 0xfffffffe)))) {
        if (__src < (void *)((long)local_1f0 + local_1a0)) {
          __n = (long)((long)local_1f0 + local_1a0) - (long)__src;
          uVar12 = 0xffffffffffffffba;
          if (__n + 3 <= local_1d0 - (long)local_248) {
            iVar5 = (int)local_1a8 + (int)__n * 8;
            *local_248 = (short)iVar5;
            *(char *)(local_248 + 1) = (char)((uint)iVar5 >> 0x10);
            switchD_00b1422a::default((void *)((long)local_248 + 3),__src,__n);
            uVar12 = __n + 3;
          }
          sVar13 = uVar12;
          if ((uVar12 < 0xffffffffffffff89) &&
             (local_248 = (undefined2 *)((long)local_248 + uVar12), sVar13 = sVar6,
             psVar22 < local_210)) {
            UVar17 = local_1b0->rep[2];
            local_258 = UVar17;
            _litEntropyWritten = *(ulong *)local_1b0->rep;
            uVar3 = _litEntropyWritten;
            if (psVar20 < psVar22) {
              UStack_25c = (U32)(_litEntropyWritten >> 0x20);
              uVar9 = (long)psVar20 - (long)(zc->seqStore).sequencesStart;
              UVar15 = litEntropyWritten;
              UVar16 = UStack_25c;
              _litEntropyWritten = uVar3;
              do {
                uVar1 = psVar20->litLength;
                uVar14 = (uint)uVar1;
                if (((zc->seqStore).longLengthPos == (U32)(uVar9 >> 3)) &&
                   (uVar14 = uVar1 + 0x10000,
                   (zc->seqStore).longLengthType != ZSTD_llt_literalLength)) {
                  uVar14 = (uint)uVar1;
                }
                uVar2 = psVar20->offBase;
                if (uVar2 < 4) {
                  uVar14 = (uVar2 + (uVar14 == 0)) - 1;
                  UVar21 = UVar15;
                  if (uVar14 != 0) {
                    if (uVar14 == 3) {
                      UVar21 = UVar15 - 1;
                    }
                    else {
                      UVar21 = (&litEntropyWritten)[uVar14];
                    }
                    if (uVar14 == 1) {
                      UVar16 = UVar17;
                    }
                    UVar17 = UVar16;
                    local_258 = UVar17;
                    _litEntropyWritten = CONCAT44(UVar15,UVar21);
                    UVar16 = UVar15;
                  }
                }
                else {
                  local_258 = UVar16;
                  _litEntropyWritten = CONCAT44(UVar15,uVar2 - 3);
                  UVar21 = uVar2 - 3;
                  UVar17 = UVar16;
                  UVar16 = UVar15;
                }
                UVar15 = UVar21;
                psVar20 = psVar20 + 1;
                uVar9 = uVar9 + 8;
              } while (psVar20 < psVar22);
            }
            local_218->rep[2] = local_258;
            *(ulong *)local_218->rep = _litEntropyWritten;
          }
          if (0xffffffffffffff88 < uVar12) {
            return sVar13;
          }
        }
        sVar6 = (long)local_248 - (long)local_230;
      }
      else {
        sVar6 = 0;
      }
    }
  }
  return sVar6;
}

Assistant:

size_t ZSTD_compressSuperBlock(ZSTD_CCtx* zc,
                               void* dst, size_t dstCapacity,
                               const void* src, size_t srcSize,
                               unsigned lastBlock)
{
    ZSTD_entropyCTablesMetadata_t entropyMetadata;

    FORWARD_IF_ERROR(ZSTD_buildBlockEntropyStats(&zc->seqStore,
          &zc->blockState.prevCBlock->entropy,
          &zc->blockState.nextCBlock->entropy,
          &zc->appliedParams,
          &entropyMetadata,
          zc->entropyWorkspace, ENTROPY_WORKSPACE_SIZE /* statically allocated in resetCCtx */), "");

    return ZSTD_compressSubBlock_multi(&zc->seqStore,
            zc->blockState.prevCBlock,
            zc->blockState.nextCBlock,
            &entropyMetadata,
            &zc->appliedParams,
            dst, dstCapacity,
            src, srcSize,
            zc->bmi2, lastBlock,
            zc->entropyWorkspace, ENTROPY_WORKSPACE_SIZE /* statically allocated in resetCCtx */);
}